

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

TupleDataGatherFunction *
duckdb::TupleDataGetGatherFunctionInternal
          (TupleDataGatherFunction *__return_storage_ptr__,LogicalType *type,bool within_collection)

{
  vector<duckdb::TupleDataGatherFunction,_true> *this;
  PhysicalType PVar1;
  pointer ppVar2;
  code *pcVar3;
  LogicalType *pLVar4;
  child_list_t<LogicalType> *pcVar5;
  InternalException *this_00;
  code *pcVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child_type;
  pointer ppVar7;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  this = &__return_storage_ptr__->child_functions;
  (__return_storage_ptr__->child_functions).
  super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>.
  super__Vector_base<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->child_functions).
  super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>.
  super__Vector_base<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->child_functions).
  super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>.
  super__Vector_base<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PVar1 = type->physical_type_;
  if (199 < PVar1) {
    if (PVar1 == VARCHAR) {
      pcVar3 = TupleDataTemplatedWithinCollectionGather<duckdb::string_t>;
      pcVar6 = TupleDataTemplatedGather<duckdb::string_t>;
    }
    else if (PVar1 == UINT128) {
      pcVar3 = TupleDataTemplatedWithinCollectionGather<duckdb::uhugeint_t>;
      pcVar6 = TupleDataTemplatedGather<duckdb::uhugeint_t>;
    }
    else {
      if (PVar1 != INT128) goto switchD_0160eee0_caseD_a;
      pcVar3 = TupleDataTemplatedWithinCollectionGather<duckdb::hugeint_t>;
      pcVar6 = TupleDataTemplatedGather<duckdb::hugeint_t>;
    }
    goto LAB_0160f113;
  }
  switch(PVar1) {
  case BOOL:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<bool>;
    pcVar6 = TupleDataTemplatedGather<bool>;
    break;
  case UINT8:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<unsigned_char>;
    pcVar6 = TupleDataTemplatedGather<unsigned_char>;
    break;
  case INT8:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<signed_char>;
    pcVar6 = TupleDataTemplatedGather<signed_char>;
    break;
  case UINT16:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<unsigned_short>;
    pcVar6 = TupleDataTemplatedGather<unsigned_short>;
    break;
  case INT16:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<short>;
    pcVar6 = TupleDataTemplatedGather<short>;
    break;
  case UINT32:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<unsigned_int>;
    pcVar6 = TupleDataTemplatedGather<unsigned_int>;
    break;
  case INT32:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<int>;
    pcVar6 = TupleDataTemplatedGather<int>;
    break;
  case UINT64:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<unsigned_long>;
    pcVar6 = TupleDataTemplatedGather<unsigned_long>;
    break;
  case INT64:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<long>;
    pcVar6 = TupleDataTemplatedGather<long>;
    break;
  default:
switchD_0160eee0_caseD_a:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._0_8_ = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Unsupported type for TupleDataCollection::GetGatherFunction","");
    InternalException::InternalException(this_00,(string *)local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<float>;
    pcVar6 = TupleDataTemplatedGather<float>;
    break;
  case DOUBLE:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<double>;
    pcVar6 = TupleDataTemplatedGather<double>;
    break;
  case INTERVAL:
    pcVar3 = TupleDataTemplatedWithinCollectionGather<duckdb::interval_t>;
    pcVar6 = TupleDataTemplatedGather<duckdb::interval_t>;
    break;
  case LIST:
    pcVar6 = TupleDataListGather;
    if (within_collection) {
      pcVar6 = TupleDataCollectionWithinCollectionGather;
    }
    __return_storage_ptr__->function = pcVar6;
    pLVar4 = ListType::GetChildType(type);
    TupleDataGetGatherFunctionInternal((TupleDataGatherFunction *)local_50,pLVar4,true);
    ::std::vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
    ::emplace_back<duckdb::TupleDataGatherFunction>
              (&this->
                super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
               ,(TupleDataGatherFunction *)local_50);
    goto LAB_0160f0e9;
  case STRUCT:
    pcVar6 = TupleDataStructGather;
    if (within_collection) {
      pcVar6 = TupleDataStructWithinCollectionGather;
    }
    __return_storage_ptr__->function = pcVar6;
    pcVar5 = StructType::GetChildTypes_abi_cxx11_(type);
    ppVar7 = (pcVar5->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (pcVar5->
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar7 == ppVar2) {
      return __return_storage_ptr__;
    }
    do {
      TupleDataGetGatherFunctionInternal
                ((TupleDataGatherFunction *)local_50,&ppVar7->second,within_collection);
      ::std::
      vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
      emplace_back<duckdb::TupleDataGatherFunction>
                (&this->
                  super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
                 ,(TupleDataGatherFunction *)local_50);
      ::std::
      vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>::
      ~vector((vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
               *)(local_50 + 8));
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar2);
    return __return_storage_ptr__;
  case ARRAY:
    pcVar6 = TupleDataListGather;
    if (within_collection) {
      pcVar6 = TupleDataCollectionWithinCollectionGather;
    }
    __return_storage_ptr__->function = pcVar6;
    pLVar4 = ArrayType::GetChildType(type);
    TupleDataGetGatherFunctionInternal((TupleDataGatherFunction *)local_50,pLVar4,true);
    ::std::vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
    ::emplace_back<duckdb::TupleDataGatherFunction>
              (&this->
                super_vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
               ,(TupleDataGatherFunction *)local_50);
LAB_0160f0e9:
    ::std::vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
    ::~vector((vector<duckdb::TupleDataGatherFunction,_std::allocator<duckdb::TupleDataGatherFunction>_>
               *)(local_50 + 8));
    return __return_storage_ptr__;
  }
LAB_0160f113:
  if (within_collection) {
    pcVar6 = pcVar3;
  }
  __return_storage_ptr__->function = pcVar6;
  return __return_storage_ptr__;
}

Assistant:

static TupleDataGatherFunction TupleDataGetGatherFunctionInternal(const LogicalType &type, bool within_collection) {
	TupleDataGatherFunction result;
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		result.function = TupleDataGetGatherFunction<bool>(within_collection);
		break;
	case PhysicalType::INT8:
		result.function = TupleDataGetGatherFunction<int8_t>(within_collection);
		break;
	case PhysicalType::INT16:
		result.function = TupleDataGetGatherFunction<int16_t>(within_collection);
		break;
	case PhysicalType::INT32:
		result.function = TupleDataGetGatherFunction<int32_t>(within_collection);
		break;
	case PhysicalType::INT64:
		result.function = TupleDataGetGatherFunction<int64_t>(within_collection);
		break;
	case PhysicalType::INT128:
		result.function = TupleDataGetGatherFunction<hugeint_t>(within_collection);
		break;
	case PhysicalType::UINT8:
		result.function = TupleDataGetGatherFunction<uint8_t>(within_collection);
		break;
	case PhysicalType::UINT16:
		result.function = TupleDataGetGatherFunction<uint16_t>(within_collection);
		break;
	case PhysicalType::UINT32:
		result.function = TupleDataGetGatherFunction<uint32_t>(within_collection);
		break;
	case PhysicalType::UINT64:
		result.function = TupleDataGetGatherFunction<uint64_t>(within_collection);
		break;
	case PhysicalType::UINT128:
		result.function = TupleDataGetGatherFunction<uhugeint_t>(within_collection);
		break;
	case PhysicalType::FLOAT:
		result.function = TupleDataGetGatherFunction<float>(within_collection);
		break;
	case PhysicalType::DOUBLE:
		result.function = TupleDataGetGatherFunction<double>(within_collection);
		break;
	case PhysicalType::INTERVAL:
		result.function = TupleDataGetGatherFunction<interval_t>(within_collection);
		break;
	case PhysicalType::VARCHAR:
		result.function = TupleDataGetGatherFunction<string_t>(within_collection);
		break;
	case PhysicalType::STRUCT: {
		result.function = within_collection ? TupleDataStructWithinCollectionGather : TupleDataStructGather;
		for (const auto &child_type : StructType::GetChildTypes(type)) {
			result.child_functions.push_back(TupleDataGetGatherFunctionInternal(child_type.second, within_collection));
		}
		break;
	}
	case PhysicalType::LIST:
		result.function = within_collection ? TupleDataCollectionWithinCollectionGather : TupleDataListGather;
		result.child_functions.push_back(TupleDataGetGatherFunctionInternal(ListType::GetChildType(type), true));
		break;
	case PhysicalType::ARRAY:
		result.function = within_collection ? TupleDataCollectionWithinCollectionGather : TupleDataListGather;
		result.child_functions.push_back(TupleDataGetGatherFunctionInternal(ArrayType::GetChildType(type), true));
		break;
	default:
		throw InternalException("Unsupported type for TupleDataCollection::GetGatherFunction");
	}
	return result;
}